

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_swap.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Base_swap<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>
::swap_rows(Base_swap<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true>_>_>_>
            *this,ID_index rowIndex1,ID_index rowIndex2)

{
  mapped_type mVar1;
  undefined4 uVar2;
  __buckets_ptr pp_Var3;
  ulong uVar4;
  ID_index IVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> __it;
  _Hash_node_base *p_Var10;
  key_type *__k;
  ID_index local_30;
  ID_index local_2c;
  
  this->rowSwapped_ = true;
  pp_Var3 = (this->indexToRow_)._M_h._M_buckets;
  uVar4 = (this->indexToRow_)._M_h._M_bucket_count;
  p_Var8 = pp_Var3[(ulong)rowIndex1 % uVar4];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var10 = p_Var8->_M_nxt, p_Var9 = p_Var8, *(ID_index *)&p_Var8->_M_nxt[1]._M_nxt != rowIndex1
     )) {
    while (p_Var8 = p_Var10, p_Var10 = p_Var8->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var10[1]._M_nxt % uVar4 != (ulong)rowIndex1 % uVar4) ||
         (p_Var9 = p_Var8, *(uint *)&p_Var10[1]._M_nxt == rowIndex1)) goto LAB_00187305;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_00187305:
  if (p_Var9 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var9->_M_nxt;
  }
  p_Var8 = pp_Var3[(ulong)rowIndex2 % uVar4];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var10 = p_Var8->_M_nxt, p_Var9 = p_Var8, *(ID_index *)&p_Var8->_M_nxt[1]._M_nxt != rowIndex2
     )) {
    while (p_Var8 = p_Var10, p_Var10 = p_Var8->_M_nxt, p_Var10 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var10[1]._M_nxt % uVar4 != (ulong)rowIndex2 % uVar4) ||
         (p_Var9 = p_Var8, *(uint *)&p_Var10[1]._M_nxt == rowIndex2)) goto LAB_00187362;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_00187362:
  if (p_Var9 == (__node_base_ptr)0x0) {
    p_Var10 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var10 = p_Var9->_M_nxt;
  }
  local_30 = rowIndex2;
  local_2c = rowIndex1;
  if (__it._M_cur == (__node_type *)0x0) {
    if (p_Var10 != (_Hash_node_base *)0x0) {
      __k = (key_type *)((long)&p_Var10[1]._M_nxt + 4);
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<unsigned_int&,unsigned_int&>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)this,&local_2c,__k);
      IVar5 = local_2c;
      pmVar6 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->rowToIndex_,__k);
      *pmVar6 = IVar5;
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,__k);
    }
  }
  else if (p_Var10 == (_Hash_node_base *)0x0) {
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,unsigned_int&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this,&local_30,(key_type *)((long)__it._M_cur + 0xc));
    IVar5 = local_30;
    pmVar6 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->rowToIndex_,(key_type *)((long)__it._M_cur + 0xc));
    *pmVar6 = IVar5;
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)this,(const_iterator)__it._M_cur);
  }
  else {
    pmVar6 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->rowToIndex_,(key_type *)((long)__it._M_cur + 0xc));
    pmVar7 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->rowToIndex_,(key_type *)((long)&p_Var10[1]._M_nxt + 4));
    mVar1 = *pmVar6;
    *pmVar6 = *pmVar7;
    *pmVar7 = mVar1;
    uVar2 = *(undefined4 *)((long)__it._M_cur + 0xc);
    *(undefined4 *)((long)__it._M_cur + 0xc) = *(undefined4 *)((long)&p_Var10[1]._M_nxt + 4);
    *(undefined4 *)((long)&p_Var10[1]._M_nxt + 4) = uVar2;
  }
  return;
}

Assistant:

inline void Base_swap<Master_matrix, Base_matrix>::swap_rows(ID_index rowIndex1, ID_index rowIndex2)
{
  rowSwapped_ = true;

  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    auto it1 = indexToRow_.find(rowIndex1);
    auto it2 = indexToRow_.find(rowIndex2);

    if (it1 == indexToRow_.end() && it2 == indexToRow_.end()) return;

    if (it1 == indexToRow_.end()) {
      indexToRow_.emplace(rowIndex1, it2->second);
      rowToIndex_.at(it2->second) = rowIndex1;
      indexToRow_.erase(it2->second);
      return;
    }

    if (it2 == indexToRow_.end()) {
      indexToRow_.emplace(rowIndex2, it1->second);
      rowToIndex_.at(it1->second) = rowIndex2;
      indexToRow_.erase(it1);
      return;
    }

    std::swap(rowToIndex_.at(it1->second), rowToIndex_.at(it2->second));
    std::swap(it1->second, it2->second);
  } else {
    for (auto i = indexToRow_.size(); i <= std::max(rowIndex1, rowIndex2); ++i) indexToRow_.push_back(i);

    std::swap(rowToIndex_[indexToRow_[rowIndex1]], rowToIndex_[indexToRow_[rowIndex2]]);
    std::swap(indexToRow_[rowIndex1], indexToRow_[rowIndex2]);
  }
}